

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,
          int offset)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int64_t iVar8;
  reference pvVar9;
  undefined4 extraout_var;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  byte bVar14;
  double x2_3;
  double x1_3;
  int64_t i2_1;
  int64_t i1_1;
  int64_t i_3;
  int64_t k_3;
  int64_t j_3;
  double x2_2;
  double x1_2;
  int64_t j2_1;
  int64_t j1_1;
  int64_t j_2;
  int64_t k_2;
  int64_t i_2;
  int64_t nRight_1;
  int64_t nLeft_1;
  int64_t d_1;
  double x2_1;
  double x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  double x2;
  double x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  int64_t d;
  undefined1 local_50 [8];
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<double> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QControlledGate2<double> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  iVar8 = dense::SquareMatrix<double>::size(matrix);
  bVar14 = (byte)nbQubits;
  if (iVar8 != 1 << (bVar14 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])(&mat1.data_);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  *pvVar9 = offset + *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  *pvVar9 = offset + *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  if (nbQubits <= *pvVar9) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  if (nbQubits <= *pvVar9) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x38))(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,(SquareMatrix<double> *)local_50);
  iVar6 = control(this);
  iVar7 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
  if (iVar6 < iVar7) {
    iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    iVar7 = control(this);
    lVar10 = (long)(1 << ((char)iVar6 - (char)iVar7 & 0x1fU));
    iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    lVar11 = (long)(1 << ((byte)iVar6 & 0x1f));
    iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    lVar12 = (long)(1 << ((bVar14 - (char)iVar6) - 1 & 0x1f));
    if (side == Left) {
      for (k = 0; iVar8 = dense::SquareMatrix<double>::rows(matrix), k < iVar8; k = k + 1) {
        for (j = 0; j < lVar11; j = j + 1) {
          if (((this->controlState_ != 0) || (j % lVar10 < lVar10 / 2)) &&
             ((this->controlState_ != 1 || (lVar10 / 2 <= j % lVar10)))) {
            for (j1 = 0; j1 < lVar12; j1 = j1 + 1) {
              lVar1 = j1 + j * lVar12 * 2;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k,lVar1);
              dVar2 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k,lVar1 + lVar12);
              dVar3 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,0);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,0);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k,lVar1);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,1);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,1);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k,lVar1 + lVar12);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
            }
          }
        }
      }
    }
    else {
      for (k_1 = 0; iVar8 = dense::SquareMatrix<double>::cols(matrix), k_1 < iVar8; k_1 = k_1 + 1) {
        for (i_1 = 0; i_1 < lVar11; i_1 = i_1 + 1) {
          if (((this->controlState_ != 0) || (i_1 % lVar10 < lVar10 / 2)) &&
             ((this->controlState_ != 1 || (lVar10 / 2 <= i_1 % lVar10)))) {
            for (i1 = 0; i1 < lVar12; i1 = i1 + 1) {
              lVar1 = i1 + i_1 * lVar12 * 2;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1,k_1);
              dVar2 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1 + lVar12,k_1);
              dVar3 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,0);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,1);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1,k_1);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,0);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,1);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1 + lVar12,k_1);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
            }
          }
        }
      }
    }
  }
  else {
    iVar6 = control(this);
    lVar10 = (long)(1 << (bVar14 - (char)iVar6 & 0x1f));
    iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    lVar11 = (long)(1 << ((byte)iVar6 & 0x1f));
    iVar6 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])();
    lVar12 = (long)(1 << ((bVar14 - (char)iVar6) - 1 & 0x1f));
    if (side == Left) {
      for (k_2 = 0; iVar8 = dense::SquareMatrix<double>::cols(matrix), k_2 < iVar8; k_2 = k_2 + 1) {
        for (j_2 = 0; j_2 < lVar11; j_2 = j_2 + 1) {
          for (j1_1 = 0; j1_1 < lVar12; j1_1 = j1_1 + 1) {
            if (((this->controlState_ != 0) || (j1_1 % lVar10 < lVar10 / 2)) &&
               ((this->controlState_ != 1 || (lVar10 / 2 <= j1_1 % lVar10)))) {
              lVar1 = j1_1 + j_2 * lVar12 * 2;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k_2,lVar1);
              dVar2 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k_2,lVar1 + lVar12);
              dVar3 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,0);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,0);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k_2,lVar1);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,1);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,1);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,k_2,lVar1 + lVar12);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
            }
          }
        }
      }
    }
    else {
      for (k_3 = 0; iVar8 = dense::SquareMatrix<double>::cols(matrix), k_3 < iVar8; k_3 = k_3 + 1) {
        for (i_3 = 0; i_3 < lVar11; i_3 = i_3 + 1) {
          for (i1_1 = 0; i1_1 < lVar12; i1_1 = i1_1 + 1) {
            if (((this->controlState_ != 0) || (i1_1 % lVar10 < lVar10 / 2)) &&
               ((this->controlState_ != 1 || (lVar10 / 2 <= i1_1 % lVar10)))) {
              lVar1 = i1_1 + i_3 * lVar12 * 2;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1,k_3);
              dVar2 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1 + lVar12,k_3);
              dVar3 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,0);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,0,1);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1,k_3);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,0);
              dVar4 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()
                                  ((SquareMatrix<double> *)local_50,1,1);
              dVar5 = *pdVar13;
              pdVar13 = dense::SquareMatrix<double>::operator()(matrix,lVar1 + lVar12,k_3);
              *pdVar13 = dVar4 * dVar2 + dVar5 * dVar3;
            }
          }
        }
      }
    }
  }
  dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat1.data_);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }